

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::
GetJavaClassFullName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,ClassNameResolver *this,string_view name_without_package,
          EnumDescriptor *descriptor,bool immutable,bool kotlin)

{
  FileDescriptor *file;
  bool bVar1;
  undefined7 in_register_00000089;
  size_type sVar2;
  string_view s;
  FixedMapping replacements;
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  sVar2 = CONCAT71(in_register_00000089,immutable);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  file = descriptor->file_;
  bVar1 = NestedInFileClass(descriptor,immutable);
  if (bVar1) {
    GetClassName_abi_cxx11_(&local_70,this,file,immutable,kotlin);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    GetFileJavaPackage_abi_cxx11_(&local_70,this,file,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_50,(char (*) [2])0x1096008,(char (*) [2])0xef511c);
  s._M_str = (char *)&local_50;
  s._M_len = (size_t)name_without_package._M_str;
  replacements._M_len = sVar2;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&local_70,(lts_20250127 *)name_without_package._M_len,s,replacements);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaClassFullName(
    absl::string_view name_without_package, const Descriptor& descriptor,
    bool immutable, bool kotlin) {
  std::string result;
  auto file = descriptor.file();
  if (NestedInFileClass(descriptor, immutable)) {
    result = GetClassName(file, immutable, kotlin);
    if (!result.empty()) result += '$';
  } else {
    result = GetFileJavaPackage(file, immutable);
    if (!result.empty()) result += '.';
  }
  result += absl::StrReplaceAll(name_without_package, {{".", "$"}});
  return result;
}